

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::loadVectors(FastText *this,string *filename)

{
  ulong uVar1;
  byte bVar2;
  int32_t iVar3;
  int32_t iVar4;
  ostream *poVar5;
  void *this_00;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  string *in_RSI;
  long in_RDI;
  Matrix *this_01;
  size_t j_1;
  int32_t idx;
  size_t i_1;
  size_t j;
  string word;
  size_t i;
  int64_t dim;
  int64_t n;
  shared_ptr<fasttext::Matrix> mat;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  ifstream in;
  undefined4 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  real rVar9;
  undefined4 in_stack_fffffffffffffca0;
  int32_t iVar10;
  undefined4 in_stack_fffffffffffffca4;
  value_type *in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcb0;
  int32_t in_stack_fffffffffffffcb4;
  long *in_stack_fffffffffffffcc0;
  long *in_stack_fffffffffffffcc8;
  ulong local_2d0;
  size_type local_2c0;
  undefined1 local_2b0 [16];
  ulong local_2a0;
  string local_298 [32];
  ulong local_278;
  ulong local_250;
  ulong local_248 [3];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_230;
  istream local_218 [536];
  
  std::ifstream::ifstream(local_218,in_RSI,_S_in);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x155abe);
  std::shared_ptr<fasttext::Matrix>::shared_ptr((shared_ptr<fasttext::Matrix> *)0x155acb);
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Pretrained vectors file cannot be opened!");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  this_00 = (void *)std::istream::operator>>(local_218,(long *)local_248);
  std::istream::operator>>(this_00,(long *)&local_250);
  poVar5 = std::operator<<((ostream *)&std::cout,"Types:");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_248[0]);
  poVar5 = std::operator<<(poVar5,"dim:");
  std::ostream::operator<<(poVar5,local_250);
  uVar1 = local_250;
  peVar6 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x155be7);
  if (uVar1 == (long)peVar6->dim) {
    std::make_shared<fasttext::Matrix,long&,long&>
              (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
    std::shared_ptr<fasttext::Matrix>::operator=
              ((shared_ptr<fasttext::Matrix> *)
               CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
               (shared_ptr<fasttext::Matrix> *)
               CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x155c73);
    for (local_278 = 0; local_278 < local_248[0]; local_278 = local_278 + 1) {
      std::__cxx11::string::string(local_298);
      std::operator>>(local_218,local_298);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                  in_stack_fffffffffffffca8);
      for (local_2a0 = 0; local_2a0 < local_250; local_2a0 = local_2a0 + 1) {
        peVar7 = std::
                 __shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x155d01);
        std::istream::operator>>(local_218,peVar7->data_ + local_278 * local_250 + local_2a0);
      }
      std::__cxx11::string::~string(local_298);
    }
    std::ifstream::close();
    peVar8 = std::
             __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x155dba);
    Dictionary::nwords(peVar8);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x155dd5);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x155df8);
    std::make_shared<fasttext::Matrix,int,int&>
              ((int *)in_stack_fffffffffffffcc8,(int *)in_stack_fffffffffffffcc0);
    this_01 = (Matrix *)(in_RDI + 0x20);
    rVar9 = (real)((ulong)local_2b0 >> 0x20);
    std::shared_ptr<fasttext::Matrix>::operator=
              ((shared_ptr<fasttext::Matrix> *)
               CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
               (shared_ptr<fasttext::Matrix> *)
               CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x155e46);
    std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x155e50);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x155e62);
    Matrix::uniform(this_01,rVar9);
    for (local_2c0 = 0; local_2c0 < local_248[0]; local_2c0 = local_2c0 + 1) {
      peVar8 = std::
               __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x155eb9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_230,local_2c0);
      iVar3 = Dictionary::getHash((Dictionary *)
                                  CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                                  (string *)peVar8);
      in_stack_fffffffffffffcb4 = iVar3;
      if (-1 < iVar3) {
        iVar10 = iVar3;
        peVar8 = std::
                 __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x155f17);
        iVar4 = Dictionary::nwords(peVar8);
        peVar6 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x155f32);
        if (iVar10 < iVar4 + peVar6->bucket) {
          for (local_2d0 = 0; local_2d0 < local_250; local_2d0 = local_2d0 + 1) {
            peVar7 = std::
                     __shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x155f7b);
            rVar9 = peVar7->data_[local_2c0 * local_250 + local_2d0];
            peVar7 = std::
                     __shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x155fb3);
            peVar7->data_[(long)iVar3 * local_250 + local_2d0] = rVar9;
          }
        }
      }
    }
    std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x15601b);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
    std::ifstream::~ifstream(local_218);
    return;
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,
                           "Dimension of pretrained vectors does not match -dim option");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

void FastText::loadVectors(std::string filename) {
  std::ifstream in(filename);
  std::vector<std::string> words;
  std::shared_ptr<Matrix> mat; // temp. matrix for pretrained vectors
  int64_t n, dim;
  if (!in.is_open()) {
    std::cerr << "Pretrained vectors file cannot be opened!" << std::endl;
    exit(EXIT_FAILURE);
  }
  in >> n >> dim;
  std::cout << "Types:" << n << "dim:" << dim;
  if (dim != args_->dim) {
    std::cerr << "Dimension of pretrained vectors does not match -dim option"
              << std::endl;
    exit(EXIT_FAILURE);
  }
  mat = std::make_shared<Matrix>(n, dim);
  for (size_t i = 0; i < n; i++) {
    std::string word;
    in >> word;
    words.push_back(word);
    //dict_->add("",word);
    for (size_t j = 0; j < dim; j++) {
      in >> mat->data_[i * dim + j];
    }
  }
  in.close();

  //dict_->threshold(1);
  input_ = std::make_shared<Matrix>(dict_->nwords()+args_->bucket, args_->dim);
  input_->uniform(1.0 / args_->dim);

  for (size_t i = 0; i < n; i++) {
    int32_t idx = dict_->getHash(words[i]);
    if (idx < 0 || idx >= dict_->nwords() + args_->bucket) continue;
    for (size_t j = 0; j < dim; j++) {
      input_->data_[idx * dim + j] = mat->data_[i * dim + j];
    }
  }
}